

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O0

int ASN1_TIME_diff(int *out_days,int *out_seconds,ASN1_TIME *from,ASN1_TIME *to)

{
  int iVar1;
  undefined1 local_a0 [8];
  tm tm_to;
  tm tm_from;
  ASN1_TIME *to_local;
  ASN1_TIME *from_local;
  int *out_seconds_local;
  int *out_days_local;
  
  iVar1 = asn1_time_to_tm((tm *)&tm_to.tm_zone,from,1);
  if (iVar1 == 0) {
    out_days_local._4_4_ = 0;
  }
  else {
    iVar1 = asn1_time_to_tm((tm *)local_a0,to,1);
    if (iVar1 == 0) {
      out_days_local._4_4_ = 0;
    }
    else {
      out_days_local._4_4_ =
           OPENSSL_gmtime_diff(out_days,out_seconds,(tm *)&tm_to.tm_zone,(tm *)local_a0);
    }
  }
  return out_days_local._4_4_;
}

Assistant:

int ASN1_TIME_diff(int *out_days, int *out_seconds, const ASN1_TIME *from,
                   const ASN1_TIME *to) {
  struct tm tm_from, tm_to;
  if (!asn1_time_to_tm(&tm_from, from, /*allow_timezone_offset=*/1)) {
    return 0;
  }
  if (!asn1_time_to_tm(&tm_to, to, /*allow_timezone_offset=*/1)) {
    return 0;
  }
  return OPENSSL_gmtime_diff(out_days, out_seconds, &tm_from, &tm_to);
}